

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O0

bool anon_unknown.dwarf_39d52f::ParseIntegral<long>(string_view str,long *out)

{
  string_view str_00;
  size_type sVar1;
  const_reference pvVar2;
  size_t *psVar3;
  basic_string_view<char,_std::char_traits<char>_> *in_RDX;
  size_type in_RDI;
  long in_FS_OFFSET;
  optional<long> opt_int;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  bool bVar4;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc8;
  undefined1 in_stack_fffffffffffffff0;
  undefined7 in_stack_fffffffffffffff1;
  char *pcVar5;
  
  pcVar5 = *(char **)(in_FS_OFFSET + 0x28);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::length(in_stack_ffffffffffffffa8);
  if (((sVar1 < 2) ||
      (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                          (in_RDX,CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0)),
      *pvVar2 != '+')) ||
     (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (in_RDX,CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0)),
     *pvVar2 != '-')) {
    bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty(in_stack_ffffffffffffffa8);
    if ((!bVar4) &&
       (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           (in_RDX,CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0)),
       *pvVar2 == '+')) {
      std::basic_string_view<char,_std::char_traits<char>_>::substr
                (in_stack_ffffffffffffffc8,
                 CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),in_RDI);
    }
    str_00._M_len._1_7_ = in_stack_fffffffffffffff1;
    str_00._M_len._0_1_ = in_stack_fffffffffffffff0;
    str_00._M_str = pcVar5;
    ToIntegral<long>(str_00);
    bVar4 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffffa8);
    if (bVar4) {
      if (in_RDX != (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
        psVar3 = (size_t *)
                 std::optional<long>::operator*((optional<long> *)in_stack_ffffffffffffffa8);
        in_RDX->_M_len = *psVar3;
      }
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
  }
  else {
    bVar4 = false;
  }
  if (*(char **)(in_FS_OFFSET + 0x28) != pcVar5) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool ParseIntegral(std::string_view str, T* out)
{
    static_assert(std::is_integral<T>::value);
    // Replicate the exact behavior of strtol/strtoll/strtoul/strtoull when
    // handling leading +/- for backwards compatibility.
    if (str.length() >= 2 && str[0] == '+' && str[1] == '-') {
        return false;
    }
    const std::optional<T> opt_int = ToIntegral<T>((!str.empty() && str[0] == '+') ? str.substr(1) : str);
    if (!opt_int) {
        return false;
    }
    if (out != nullptr) {
        *out = *opt_int;
    }
    return true;
}